

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O3

void __thiscall rcg::GenTLException::~GenTLException(GenTLException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__GenTLException_00132c50;
  pcVar1 = (this->s)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->s).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

GenTLException::~GenTLException()
{ }